

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test<linq::IEnumerable<int>>(IEnumerable<int> *source)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source_00;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  vector<int,_std::allocator<int>_> *source_05;
  vector<int,_std::allocator<int>_> *source_06;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  anon_class_1_0_00000001 local_11a;
  allocator_type local_119;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_118;
  vector<int,_std::allocator<int>_> local_e8;
  undefined1 local_d0 [16];
  undefined **local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [16];
  iterator local_a0;
  iterator local_98;
  IState<int> local_90;
  iterator local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_78;
  int local_48 [8];
  
  iVar2 = linq::Min<linq::IEnumerable<int>,linq::IEnumerable<int>::Min()::_lambda(auto:1_const&)_1_>
                    (source,(anon_class_1_0_00000001 *)local_d0);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::Max<linq::IEnumerable<int>,linq::IEnumerable<int>::Max()::_lambda(auto:1_const&)_1_>
                    (source,(anon_class_1_0_00000001 *)local_d0);
  assertEquals<int,int>(10,iVar2);
  sVar3 = linq::IEnumerable<int>::Count(source);
  assertEquals<int,unsigned_long>(8,sVar3);
  iVar2 = linq::Sum<linq::IEnumerable<int>,linq::IEnumerable<int>::Sum()::_lambda(auto:1_const&)_1_>
                    (source,(anon_class_1_0_00000001 *)local_d0);
  assertEquals<int,int>(0x34,iVar2);
  linq::IEnumerable<int>::Take
            ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)local_d0,source,3);
  iVar2 = linq::
          Min<linq::TakeState<linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((TakeState<linq::IEnumerable<int>,_int> *)local_d0,
                     (anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(3,iVar2);
  local_d0._0_8_ = &PTR_Init_00158390;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::Take
            ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)local_d0,source,3);
  iVar2 = linq::
          Max<linq::TakeState<linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((TakeState<linq::IEnumerable<int>,_int> *)local_d0,
                     (anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(5,iVar2);
  local_d0._0_8_ = &PTR_Init_00158390;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::Skip
            ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)local_d0,source,3);
  iVar2 = linq::
          Min<linq::SkipState<linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((SkipState<linq::IEnumerable<int>,_int> *)local_d0,
                     (anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(6,iVar2);
  local_d0._0_8_ = &PTR_Init_001583d8;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::Skip
            ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)local_d0,source,3);
  iVar2 = linq::
          Max<linq::SkipState<linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((SkipState<linq::IEnumerable<int>,_int> *)local_d0,
                     (anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(10,iVar2);
  local_d0._0_8_ = &PTR_Init_001583d8;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_1_>
            ((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
              *)local_d0,source,(anon_class_1_0_00000001_for_filter *)&local_e8);
  iVar2 = linq::
          Min<linq::TakeWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_1_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                      *)local_d0,(anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(3,iVar2);
  local_d0._0_8_ = &PTR_Init_00158420;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_2_>
            ((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
              *)local_d0,source,(anon_class_1_0_00000001_for_filter *)&local_e8);
  iVar2 = linq::
          Max<linq::TakeWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_2_,int>,linq::IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_2_,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                      *)local_d0,(anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(4,iVar2);
  local_d0._0_8_ = &PTR_Init_00158468;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  SkipWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_3_>
            ((IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
              *)local_d0,source,(anon_class_1_0_00000001_for_filter *)&local_e8);
  iVar2 = linq::
          Min<linq::SkipWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_3_,int>,linq::IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_3_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>
                      *)local_d0,(anon_class_1_0_00000001 *)&local_118);
  assertEquals<int,int>(5,iVar2);
  local_d0._0_8_ = &PTR_Init_001584b0;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_4_>
            ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
              *)local_d0,source,(anon_class_1_0_00000001_for_filter *)&local_118);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(4,sVar3);
  local_d0._0_8_ = &PTR_Init_001584f8;
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_5_>
            ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
              *)&local_118,source,(anon_class_1_0_00000001_for_filter *)&local_e8);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip((IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
          *)local_d0,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
          *)&local_118,1);
  iVar2 = linq::
          First<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_5_,int>,int>>
                    ((SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>
                      *)local_d0);
  assertEquals<int,int>(6,iVar2);
  local_d0._0_8_ = &PTR_Init_00158588;
  local_d0._8_8_ = &PTR_Init_00158540;
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158540;
  local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_6_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)local_d0,source,(anon_class_1_0_00000001 *)&local_118);
  sVar3 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          ::Count((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(2,sVar3);
  local_d0._0_8_ = &PTR_Init_001585e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_90);
  if ((_Manager_type)local_a0._M_current != (_Manager_type)0x0) {
    (*(code *)local_a0._M_current)(local_b0,local_b0,3);
  }
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_7_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)local_d0,source,(anon_class_1_0_00000001 *)&local_e8);
  linq::First<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
            ((OUT *)&local_118,(linq *)local_d0,source_00);
  sVar3 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)&local_118);
  assertEquals<int,unsigned_long>(6,sVar3);
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_d0._0_8_ = &PTR_Init_001585e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_90);
  if ((_Manager_type)local_a0._M_current != (_Manager_type)0x0) {
    (*(code *)local_a0._M_current)(local_b0,local_b0,3);
  }
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_8_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)local_d0,source,(anon_class_1_0_00000001 *)&local_e8);
  linq::Last<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
            ((OUT *)&local_118,(linq *)local_d0,source_01);
  sVar3 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)&local_118);
  assertEquals<int,unsigned_long>(2,sVar3);
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_d0._0_8_ = &PTR_Init_001585e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_90);
  if ((_Manager_type)local_a0._M_current != (_Manager_type)0x0) {
    (*(code *)local_a0._M_current)(local_b0,local_b0,3);
  }
  local_d0._8_8_ = &PTR_Init_00157b88;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  iVar2 = linq::IEnumerable<int>::
          Single<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_9_>
                    (source,(anon_class_1_0_00000001_for_filter *)local_d0);
  assertEquals<int,int>(5,iVar2);
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l,&local_119);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_118,(linq *)&local_e8,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_d0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_118,source);
  iVar2 = linq::
          Min<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerable<int>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerable<int>&>(linq::IEnumerable<int>&)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerable<int>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerable<int>&>(linq::IEnumerable<int>&)::_lambda(int)_1_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                      *)local_d0,&local_11a);
  assertEquals<int,int>(5,iVar2);
  local_d0._0_8_ = &PTR_Init_00158780;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  local_90._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if ((_Base_ptr)local_80._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_current);
  }
  local_c0 = &PTR_Init_001581f8;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_b8._M_pi,local_b0._8_8_ - (long)local_b8._M_pi);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if ((element_type *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_00,&local_119);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_118,(linq *)&local_e8,source_03);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_d0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_118,source);
  iVar2 = linq::
          Max<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerable<int>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerable<int>&>(linq::IEnumerable<int>&)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerable<int>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerable<int>&>(linq::IEnumerable<int>&)::_lambda(int)_1_,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                      *)local_d0,(anon_class_1_0_00000001 *)&local_11a);
  assertEquals<int,int>(7,iVar2);
  local_d0._0_8_ = &PTR_Init_00158780;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  local_90._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if ((_Base_ptr)local_80._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_current);
  }
  local_c0 = &PTR_Init_001581f8;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_b8._M_pi,local_b0._8_8_ - (long)local_b8._M_pi);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if ((element_type *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_01._M_len = 5;
  __l_01._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_01,(allocator_type *)&local_11a);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_118,(linq *)&local_e8,source_04);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_d0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_118,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(3,sVar3);
  local_d0._0_8_ = &PTR_Init_00158780;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  local_90._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if ((_Base_ptr)local_80._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_current);
  }
  local_c0 = &PTR_Init_001581f8;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_b8._M_pi,local_b0._8_8_ - (long)local_b8._M_pi);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if ((element_type *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_02._M_len = 5;
  __l_02._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_02,(allocator_type *)&local_11a);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_118,(linq *)&local_e8,source_05);
  linq::IEnumerable<int>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_d0,source,&local_118);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(3,sVar3);
  local_d0._0_8_ = &PTR_Init_001587c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  local_b0._8_8_ = &PTR_Init_001581f8;
  if ((_Manager_type)local_a0._M_current != (_Manager_type)0x0) {
    operator_delete(local_a0._M_current,(long)local_90._vptr_IState - (long)local_a0._M_current);
  }
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if ((element_type *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_03._M_len = 5;
  __l_03._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_03,(allocator_type *)&local_11a);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_118,(linq *)&local_e8,source_06);
  linq::IEnumerable<int>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_d0,source,&local_118);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(5,sVar3);
  local_d0._0_8_ = &PTR_Init_00158810;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  local_b0._8_8_ = &PTR_Init_001581f8;
  if ((_Manager_type)local_a0._M_current != (_Manager_type)0x0) {
    operator_delete(local_a0._M_current,(long)local_90._vptr_IState - (long)local_a0._M_current);
  }
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  if ((element_type *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  ((IState<int> *)
  local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start)->_vptr_IState = (_func_int **)&PTR_Init_00158298;
  ((IState<int> *)
  ((long)local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start + 8))->_vptr_IState = (_func_int **)0x900000005;
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<linq::IState<int>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (IState<int> *)
             local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_d0,source,(IEnumerable<int> *)&local_118);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(3,sVar3);
  local_d0._0_8_ = &PTR_Init_00158858;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_90);
  local_b0._8_8_ = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current);
  }
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  local_118.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_118.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  linq::IEnumerable<int>::Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_d0,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(8,sVar3);
  local_d0._0_8_ = &PTR_Init_001588a0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_90);
  local_b0._8_8_ = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current);
  }
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_d0,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_d0);
  assertEquals<int,unsigned_long>(0,sVar3);
  local_d0._0_8_ = &PTR_Init_00158858;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_90);
  local_b0._8_8_ = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current);
  }
  local_c0 = &PTR_Init_00157b88;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_);
  }
  (**((source->state).super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_IState)();
  iVar2 = (*((source->state).super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IState[1])();
  assertEquals<bool,bool>(true,SUB41(iVar2,0));
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_10_>
                    (source,(anon_class_1_0_00000001_for_filter *)local_d0);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          All<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_11_>
                    (source,(anon_class_1_0_00000001 *)local_d0);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_12_>
                    (source,(anon_class_1_0_00000001_for_filter *)local_d0);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          All<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_13_>
                    (source,(anon_class_1_0_00000001 *)local_d0);
  assertEquals<bool,bool>(true,bVar1);
  local_d0._0_4_ = 6;
  bVar1 = linq::Contains<linq::IEnumerable<int>,int>(source,(int *)local_d0);
  assertEquals<bool,bool>(true,bVar1);
  local_d0._0_4_ = 0x10;
  bVar1 = linq::Contains<linq::IEnumerable<int>,int>(source,(int *)local_d0);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}